

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ManchesterSimulationDataGenerator::SimWriteBit(ManchesterSimulationDataGenerator *this,U32 bit)

{
  int iVar1;
  int iVar2;
  BitState start_bit_state;
  U32 bit_local;
  ManchesterSimulationDataGenerator *this_local;
  
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  iVar1 = (int)this;
  switch(this->mSettings->mMode) {
  case MANCHESTER:
    if ((this->mSettings->mInverted & 1U) == 0) {
      if ((bit == 0) && (iVar2 == 1)) {
        SimulationChannelDescriptor::Transition();
      }
      else if ((bit == 1) && (iVar2 == 0)) {
        SimulationChannelDescriptor::Transition();
      }
    }
    else if ((bit == 1) && (iVar2 == 1)) {
      SimulationChannelDescriptor::Transition();
    }
    else if ((bit == 0) && (iVar2 == 0)) {
      SimulationChannelDescriptor::Transition();
    }
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    break;
  case DIFFERENTIAL_MANCHESTER:
    if (bit == 0) {
      SimulationChannelDescriptor::Transition();
    }
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    break;
  case BI_PHASE_MARK:
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    if (bit == 1) {
      SimulationChannelDescriptor::Transition();
    }
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    break;
  case BI_PHASE_SPACE:
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
    if (bit == 0) {
      SimulationChannelDescriptor::Transition();
    }
    SimulationChannelDescriptor::Advance(iVar1 + 0x20);
  }
  return;
}

Assistant:

void ManchesterSimulationDataGenerator::SimWriteBit( U32 bit )
{
    BitState start_bit_state = mManchesterSimulationData.GetCurrentBitState();
    switch( mSettings->mMode )
    {
    case MANCHESTER:
    {
        if( mSettings->mInverted == false )
        {
            if( ( bit == 0 ) && ( start_bit_state == BIT_HIGH ) )
                mManchesterSimulationData.Transition();
            else if( ( bit == 1 ) && ( start_bit_state == BIT_LOW ) )
                mManchesterSimulationData.Transition();
        }
        else
        {
            if( ( bit == 1 ) && ( start_bit_state == BIT_HIGH ) )
                mManchesterSimulationData.Transition();
            else if( ( bit == 0 ) && ( start_bit_state == BIT_LOW ) )
                mManchesterSimulationData.Transition();
        }
        mManchesterSimulationData.Advance( U32( mT ) );
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    case DIFFERENTIAL_MANCHESTER:
    {
        if( bit == 0 )
            mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    case BI_PHASE_MARK:
    {
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
        if( bit == 1 )
            mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    case BI_PHASE_SPACE:
    {
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
        if( bit == 0 )
            mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    }
}